

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOAnimation.cpp
# Opt level: O1

void __thiscall
Assimp::LWO::AnimResolver::GetKeys
          (AnimResolver *this,vector<aiVectorKey,_std::allocator<aiVectorKey>_> *out,
          Envelope *_envl_x,Envelope *_envl_y,Envelope *_envl_z,uint _flags)

{
  pointer *ppaVar1;
  double dVar2;
  double dVar3;
  Envelope *pEVar4;
  Key *pKVar5;
  Key *pKVar6;
  double dVar7;
  long lVar8;
  ulong uVar9;
  Key *pKVar10;
  pointer paVar11;
  ulong uVar12;
  iterator __position;
  undefined4 uVar13;
  undefined4 uVar14;
  aiVectorKey fill;
  Envelope def_z;
  Envelope def_y;
  Envelope def_x;
  Key local_100;
  aiVectorKey local_d8;
  undefined1 local_c0 [16];
  pointer local_b0;
  iterator iStack_a8;
  Key *local_a0;
  size_t sStack_98;
  size_t local_90;
  undefined1 local_88 [16];
  pointer local_78;
  iterator iStack_70;
  Key *local_68;
  size_t sStack_60;
  size_t local_58;
  undefined1 local_50 [16];
  pointer local_40;
  pointer pKStack_38;
  pointer local_30;
  size_t sStack_28;
  size_t local_20;
  
  this->envl_x = _envl_x;
  this->envl_y = _envl_y;
  this->envl_z = _envl_z;
  this->flags = _flags;
  local_50._0_4_ = 0;
  local_50._4_4_ = EnvelopeType_Unknown;
  local_50._8_4_ = PrePostBehaviour_Constant;
  local_50._12_4_ = PrePostBehaviour_Constant;
  local_40 = (pointer)0x0;
  pKStack_38 = (pointer)0x0;
  local_30 = (pointer)0x0;
  sStack_28 = 0;
  local_20 = 0;
  local_88._0_4_ = 0;
  local_88._4_4_ = EnvelopeType_Unknown;
  local_88._8_4_ = PrePostBehaviour_Constant;
  local_88._12_4_ = PrePostBehaviour_Constant;
  local_78 = (pointer)0x0;
  iStack_70._M_current = (Key *)0x0;
  local_68 = (Key *)0x0;
  sStack_60 = 0;
  local_58 = 0;
  local_c0._0_4_ = 0;
  local_c0._4_4_ = EnvelopeType_Unknown;
  local_c0._8_4_ = PrePostBehaviour_Constant;
  local_c0._12_4_ = PrePostBehaviour_Constant;
  local_b0 = (pointer)0x0;
  iStack_a8._M_current = (Key *)0x0;
  local_a0 = (Key *)0x0;
  sStack_98 = 0;
  local_90 = 0;
  local_100.time = 0.0;
  local_100.params[0] = 0.0;
  local_100.params[1] = 0.0;
  local_100.params[2] = 0.0;
  local_100.params[3] = 0.0;
  local_100.params[4] = 0.0;
  if ((((_envl_x == (Envelope *)0x0) || (_envl_x->type != EnvelopeType_Scaling_X)) &&
      ((_envl_y == (Envelope *)0x0 || (_envl_y->type != EnvelopeType_Scaling_Y)))) &&
     ((_envl_z == (Envelope *)0x0 || (_envl_z->type != EnvelopeType_Scaling_Z)))) {
    local_100.value = 0.0;
  }
  else {
    local_100.value = 1.0;
  }
  local_100.inter = IT_LINE;
  if (_envl_x == (Envelope *)0x0) {
    this->envl_x = (Envelope *)local_50;
    std::vector<Assimp::LWO::Key,std::allocator<Assimp::LWO::Key>>::
    _M_realloc_insert<Assimp::LWO::Key_const&>
              ((vector<Assimp::LWO::Key,std::allocator<Assimp::LWO::Key>> *)&local_40,(iterator)0x0,
               &local_100);
  }
  if (this->envl_y == (Envelope *)0x0) {
    this->envl_y = (Envelope *)local_88;
    if (iStack_70._M_current == local_68) {
      std::vector<Assimp::LWO::Key,std::allocator<Assimp::LWO::Key>>::
      _M_realloc_insert<Assimp::LWO::Key_const&>
                ((vector<Assimp::LWO::Key,std::allocator<Assimp::LWO::Key>> *)&local_78,iStack_70,
                 &local_100);
    }
    else {
      *(ulong *)((iStack_70._M_current)->params + 4) =
           CONCAT44(local_100._36_4_,local_100.params[4]);
      *(undefined8 *)(iStack_70._M_current)->params = local_100.params._0_8_;
      *(undefined8 *)((iStack_70._M_current)->params + 2) = local_100.params._8_8_;
      (iStack_70._M_current)->time = local_100.time;
      (iStack_70._M_current)->value = local_100.value;
      (iStack_70._M_current)->inter = local_100.inter;
      iStack_70._M_current = iStack_70._M_current + 1;
    }
  }
  if (this->envl_z == (Envelope *)0x0) {
    this->envl_z = (Envelope *)local_c0;
    if (iStack_a8._M_current == local_a0) {
      std::vector<Assimp::LWO::Key,std::allocator<Assimp::LWO::Key>>::
      _M_realloc_insert<Assimp::LWO::Key_const&>
                ((vector<Assimp::LWO::Key,std::allocator<Assimp::LWO::Key>> *)&local_b0,iStack_a8,
                 &local_100);
    }
    else {
      *(ulong *)((iStack_a8._M_current)->params + 4) =
           CONCAT44(local_100._36_4_,local_100.params[4]);
      *(undefined8 *)(iStack_a8._M_current)->params = local_100.params._0_8_;
      *(undefined8 *)((iStack_a8._M_current)->params + 2) = local_100.params._8_8_;
      (iStack_a8._M_current)->time = local_100.time;
      (iStack_a8._M_current)->value = local_100.value;
      (iStack_a8._M_current)->inter = local_100.inter;
      iStack_a8._M_current = iStack_a8._M_current + 1;
    }
  }
  if ((this->flags & 1) == 0) {
    uVar12 = ((long)(this->envl_x->keys).
                    super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(this->envl_x->keys).
                    super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3) * -0x3333333333333333;
    lVar8 = (long)(this->envl_z->keys).
                  super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(this->envl_z->keys).
                  super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3;
    uVar9 = lVar8 * -0x3333333333333333;
    if (uVar9 <= uVar12 && uVar12 + lVar8 * 0x3333333333333333 != 0) {
      uVar9 = uVar12;
    }
  }
  else {
    uVar9 = -(ulong)(this->sample_rate != 0.0);
    dVar7 = (double)(~uVar9 & 0x4059000000000000 | (ulong)this->sample_rate & uVar9);
    this->sample_delta = 1.0 / dVar7;
    dVar2 = (this->envl_z->keys).
            super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>._M_impl.
            super__Vector_impl_data._M_finish[-1].time;
    uVar13 = SUB84(dVar2,0);
    uVar14 = (undefined4)((ulong)dVar2 >> 0x20);
    dVar3 = (this->envl_y->keys).
            super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>._M_impl.
            super__Vector_impl_data._M_finish[-1].time;
    if (dVar2 <= dVar3) {
      uVar13 = SUB84(dVar3,0);
      uVar14 = (undefined4)((ulong)dVar3 >> 0x20);
    }
    dVar2 = (this->envl_x->keys).
            super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>._M_impl.
            super__Vector_impl_data._M_finish[-1].time;
    if ((double)CONCAT44(uVar14,uVar13) <= dVar2) {
      uVar13 = SUB84(dVar2,0);
      uVar14 = (undefined4)((ulong)dVar2 >> 0x20);
    }
    dVar7 = (double)CONCAT44(uVar14,uVar13) * dVar7;
    uVar9 = (ulong)dVar7;
    uVar9 = (long)(dVar7 - 9.223372036854776e+18) & (long)uVar9 >> 0x3f | uVar9;
  }
  __position._M_current = (aiVectorKey *)((uVar9 >> 1) + uVar9);
  std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::reserve
            (out,(size_type)__position._M_current);
  pEVar4 = this->envl_y;
  (this->cur_x)._M_current =
       (this->envl_x->keys).super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (this->cur_y)._M_current =
       (pEVar4->keys).super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (this->cur_z)._M_current =
       (this->envl_z->keys).super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>.
       _M_impl.super__Vector_impl_data._M_start;
  this->end_z = false;
  this->end_x = false;
  this->end_y = false;
  do {
    local_d8.mTime = 0.0;
    local_d8.mValue.x = 0.0;
    local_d8.mValue.y = 0.0;
    local_d8.mValue.z = 0.0;
    pKVar10 = (this->cur_x)._M_current;
    pKVar5 = (this->cur_y)._M_current;
    dVar2 = pKVar10->time;
    dVar3 = pKVar5->time;
    uVar13 = SUB84(dVar3,0);
    uVar14 = (undefined4)((ulong)dVar3 >> 0x20);
    if (dVar2 == dVar3) {
      pKVar6 = (this->cur_z)._M_current;
      if ((dVar2 != pKVar6->time) || (NAN(dVar2) || NAN(pKVar6->time))) goto LAB_006a4dc4;
      local_d8.mValue.y = pKVar5->value;
      local_d8.mValue.x = pKVar10->value;
      local_d8.mValue.z = pKVar6->value;
      local_d8.mTime = dVar2;
    }
    else {
LAB_006a4dc4:
      if ((dVar3 < dVar2) || (this->end_x != false)) {
        pKVar5 = (this->cur_z)._M_current;
        if (((dVar3 < pKVar5->time) || (this->end_y != false)) && (this->end_y != false)) {
          if (this->end_x != false) {
            pKVar10 = pKVar5;
          }
          uVar13 = SUB84(pKVar10->time,0);
          uVar14 = (undefined4)((ulong)pKVar10->time >> 0x20);
        }
      }
      else {
        dVar3 = ((this->cur_z)._M_current)->time;
        uVar13 = SUB84(dVar3,0);
        uVar14 = (undefined4)((ulong)dVar3 >> 0x20);
        if ((dVar2 < dVar3) || (this->end_z != false)) {
          uVar13 = SUB84(dVar2,0);
          uVar14 = (undefined4)((ulong)dVar2 >> 0x20);
        }
      }
      InterpolateTrack(this,(vector<aiVectorKey,_std::allocator<aiVectorKey>_> *)
                            __position._M_current,&local_d8,(double)CONCAT44(uVar14,uVar13));
    }
    dVar2 = local_d8.mTime;
    __position._M_current =
         (out->super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (out->super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiVectorKey,std::allocator<aiVectorKey>>::_M_realloc_insert<aiVectorKey_const&>
                ((vector<aiVectorKey,std::allocator<aiVectorKey>> *)out,__position,&local_d8);
    }
    else {
      *(ulong *)&((__position._M_current)->mValue).z = CONCAT44(local_d8._20_4_,local_d8.mValue.z);
      (__position._M_current)->mTime = local_d8.mTime;
      ((__position._M_current)->mValue).x = local_d8.mValue.x;
      ((__position._M_current)->mValue).y = local_d8.mValue.y;
      ppaVar1 = &(out->super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppaVar1 = *ppaVar1 + 1;
    }
    pKVar10 = (this->cur_x)._M_current;
    if (pKVar10->time <= dVar2) {
      if (pKVar10 ==
          (this->envl_x->keys).
          super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>._M_impl.
          super__Vector_impl_data._M_finish + -1) {
        this->end_x = true;
      }
      else {
        (this->cur_x)._M_current = pKVar10 + 1;
      }
    }
    pKVar10 = (this->cur_y)._M_current;
    if (pKVar10->time <= dVar2) {
      if (pKVar10 ==
          (this->envl_y->keys).
          super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>._M_impl.
          super__Vector_impl_data._M_finish + -1) {
        this->end_y = true;
      }
      else {
        (this->cur_y)._M_current = pKVar10 + 1;
      }
    }
    pKVar10 = (this->cur_z)._M_current;
    if (pKVar10->time <= dVar2) {
      if (pKVar10 ==
          (this->envl_z->keys).
          super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>._M_impl.
          super__Vector_impl_data._M_finish + -1) {
        this->end_z = true;
      }
      else {
        (this->cur_z)._M_current = pKVar10 + 1;
      }
    }
    if (((this->end_x == true) && (this->end_y == true)) && (this->end_z != false)) {
      if ((this->flags & 2) != 0) {
        for (paVar11 = (out->super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>)._M_impl.
                       super__Vector_impl_data._M_start;
            paVar11 !=
            (out->super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>)._M_impl.
            super__Vector_impl_data._M_finish; paVar11 = paVar11 + 1) {
          paVar11->mTime = paVar11->mTime - this->first;
        }
      }
      if (local_b0 != (pointer)0x0) {
        operator_delete(local_b0,(long)local_a0 - (long)local_b0);
      }
      if (local_78 != (pointer)0x0) {
        operator_delete(local_78,(long)local_68 - (long)local_78);
      }
      if (local_40 != (pointer)0x0) {
        operator_delete(local_40,(long)local_30 - (long)local_40);
      }
      return;
    }
  } while( true );
}

Assistant:

void AnimResolver::GetKeys(std::vector<aiVectorKey>& out,
    LWO::Envelope* _envl_x,
    LWO::Envelope* _envl_y,
    LWO::Envelope* _envl_z,
    unsigned int _flags)
{
    envl_x = _envl_x;
    envl_y = _envl_y;
    envl_z = _envl_z;
    flags  = _flags;

    // generate default channels if none are given
    LWO::Envelope def_x, def_y, def_z;
    LWO::Key key_dummy;
    key_dummy.time = 0.f;
    if ((envl_x && envl_x->type == LWO::EnvelopeType_Scaling_X) ||
        (envl_y && envl_y->type == LWO::EnvelopeType_Scaling_Y) ||
        (envl_z && envl_z->type == LWO::EnvelopeType_Scaling_Z)) {
        key_dummy.value = 1.f;
    }
    else key_dummy.value = 0.f;

    if (!envl_x) {
        envl_x = &def_x;
        envl_x->keys.push_back(key_dummy);
    }
    if (!envl_y) {
        envl_y = &def_y;
        envl_y->keys.push_back(key_dummy);
    }
    if (!envl_z) {
        envl_z = &def_z;
        envl_z->keys.push_back(key_dummy);
    }

    // guess how many keys we'll get
    size_t reserve;
    double sr = 1.;
    if (flags & AI_LWO_ANIM_FLAG_SAMPLE_ANIMS) {
        if (!sample_rate)
            sr = 100.f;
        else sr = sample_rate;
        sample_delta = 1.f / sr;

        reserve = (size_t)(
            std::max( envl_x->keys.rbegin()->time,
            std::max( envl_y->keys.rbegin()->time, envl_z->keys.rbegin()->time )) * sr);
    }
    else reserve = std::max(envl_x->keys.size(),std::max(envl_x->keys.size(),envl_z->keys.size()));
    out.reserve(reserve+(reserve>>1));

    // Iterate through all three arrays at once - it's tricky, but
    // rather interesting to implement.
    cur_x = envl_x->keys.begin();
    cur_y = envl_y->keys.begin();
    cur_z = envl_z->keys.begin();

    end_x = end_y = end_z = false;
    while (1) {

        aiVectorKey fill;

        if ((*cur_x).time == (*cur_y).time && (*cur_x).time == (*cur_z).time ) {

            // we have a keyframe for all of them defined .. this means
            // we don't need to interpolate here.
            fill.mTime = (*cur_x).time;

            fill.mValue.x = (*cur_x).value;
            fill.mValue.y = (*cur_y).value;
            fill.mValue.z = (*cur_z).value;

            // subsample animation track
            if (flags & AI_LWO_ANIM_FLAG_SAMPLE_ANIMS) {
                //SubsampleAnimTrack(out,cur_x, cur_y, cur_z, d, sample_delta);
            }
        }

        // Find key with lowest time value
        else if ((*cur_x).time <= (*cur_y).time && !end_x) {

            if ((*cur_z).time <= (*cur_x).time && !end_z) {
                InterpolateTrack(out,fill,(*cur_z).time);
            }
            else {
                InterpolateTrack(out,fill,(*cur_x).time);
            }
        }
        else if ((*cur_z).time <= (*cur_y).time && !end_y)  {
            InterpolateTrack(out,fill,(*cur_y).time);
        }
        else if (!end_y) {
            // welcome on the server, y
            InterpolateTrack(out,fill,(*cur_y).time);
        }
        else {
            // we have reached the end of at least 2 channels,
            // only one is remaining. Extrapolate the 2.
            if (end_y) {
                InterpolateTrack(out,fill,(end_x ? (*cur_z) : (*cur_x)).time);
            }
            else if (end_x) {
                InterpolateTrack(out,fill,(end_z ? (*cur_y) : (*cur_z)).time);
            }
            else { // if (end_z)
                InterpolateTrack(out,fill,(end_y ? (*cur_x) : (*cur_y)).time);
            }
        }
        double lasttime = fill.mTime;
        out.push_back(fill);

        if (lasttime >= (*cur_x).time) {
            if (cur_x != envl_x->keys.end()-1)
                ++cur_x;
            else end_x = true;
        }
        if (lasttime >= (*cur_y).time) {
            if (cur_y != envl_y->keys.end()-1)
                ++cur_y;
            else end_y = true;
        }
        if (lasttime >= (*cur_z).time) {
            if (cur_z != envl_z->keys.end()-1)
                ++cur_z;
            else end_z = true;
        }

        if( end_x && end_y && end_z ) /* finished? */
            break;
    }

    if (flags & AI_LWO_ANIM_FLAG_START_AT_ZERO) {
        for (std::vector<aiVectorKey>::iterator it = out.begin(); it != out.end(); ++it)
            (*it).mTime -= first;
    }
}